

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::SharedBasicVarCase::SharedBasicVarCase
          (SharedBasicVarCase *this,Context *context,char *name,DataType basicType,
          Precision precision,UVec3 *workGroupSize)

{
  char *pcVar1;
  ostream *poVar2;
  char *local_1c8 [4];
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (precision != PRECISION_LAST) {
    pcVar1 = glu::getPrecisionName(precision);
    poVar2 = std::operator<<(&local_1a8,pcVar1);
    std::operator<<(poVar2," ");
  }
  pcVar1 = glu::getDataTypeName(basicType);
  poVar2 = std::operator<<(&local_1a8,pcVar1);
  poVar2 = std::operator<<(poVar2,", work group size = ");
  tcu::operator<<(poVar2,workGroupSize);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SharedBasicVarCase_01e4fd70;
  this->m_basicType = basicType;
  this->m_precision = precision;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,workGroupSize);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

SharedBasicVarCase::SharedBasicVarCase (Context& context, const char* name, DataType basicType, Precision precision, const tcu::UVec3& workGroupSize)
	: TestCase			(context, name, getBasicCaseDescription(basicType, precision, workGroupSize).c_str())
	, m_basicType		(basicType)
	, m_precision		(precision)
	, m_workGroupSize	(workGroupSize)
	, m_program			(DE_NULL)
{
}